

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O2

void __thiscall
TTD::TextFormatReader::ReadKey(TextFormatReader *this,Key keyCheck,bool readSeparator)

{
  ParseTokenKind PVar1;
  int iVar2;
  ulong in_RAX;
  undefined3 in_register_00000011;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  (*(this->super_FileReader)._vptr_FileReader[2])
            (this,(ulong)CONCAT31(in_register_00000011,readSeparator));
  PVar1 = ScanKey(this,&this->m_charListPrimary);
  if (PVar1 == String) {
    uStack_28 = uStack_28 & 0xffffffffffff;
    JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (&this->m_charListPrimary,(char16_t *)((long)&uStack_28 + 6));
    if (((byte)(keyCheck - count) < 0x77) && (this->m_keyNameArray[keyCheck] != (char16_t *)0x0)) {
      iVar2 = PAL_wcscmp((this->m_charListPrimary).
                         super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>.buffer
                         ,this->m_keyNameArray[keyCheck]);
      if (iVar2 == 0) {
        PVar1 = Scan(this,&this->m_charListDiscard);
        if (PVar1 == Colon) {
          return;
        }
      }
    }
  }
  TTDAbort_unrecoverable_error("Error in parse.");
}

Assistant:

void TextFormatReader::ReadKey(NSTokens::Key keyCheck, bool readSeparator)
    {
        this->ReadSeparator(readSeparator);

        //We do a special scan here for a key (instead of the more general scan we call elsewhere)
        NSTokens::ParseTokenKind tok = this->ScanKey(this->m_charListPrimary);
        TTDAssert(tok == NSTokens::ParseTokenKind::String, "Error in parse.");

        this->m_charListPrimary.Add(_u('\0'));
        const char16* keystr = this->m_charListPrimary.GetBuffer();

        //check key strings are the same
        TTDAssert(1 <= (uint32)keyCheck && (uint32)keyCheck < (uint32)NSTokens::Key::Count, "Error in parse.");
        const char16* kname = this->m_keyNameArray[(uint32)keyCheck];
        TTDAssert(kname != nullptr, "Error in parse.");
        TTDAssert(wcscmp(keystr, kname) == 0, "Error in parse.");

        NSTokens::ParseTokenKind toksep = this->Scan(this->m_charListDiscard);
        TTDAssert(toksep == NSTokens::ParseTokenKind::Colon, "Error in parse.");
    }